

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (UnorderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  ulong uVar1;
  LocalSet *pLVar2;
  ulong uVar3;
  
  uVar1 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3] == *x) {
        return NoError;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    if (2 < uVar1) {
      __assert_fail("this->used <= N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0x3e,
                    "InsertResult wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                   );
    }
    if (uVar1 == 2) {
      return CouldNotInsert;
    }
  }
  pLVar2 = *x;
  (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = uVar1 + 1;
  (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar1] = pLVar2;
  return NoError;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }